

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

int __thiscall tcu::CaseTreeNode::findChildNdx(CaseTreeNode *this,string *name)

{
  pointer ppCVar1;
  __type_conflict _Var2;
  int ndx;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    ppCVar1 = (this->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_children).
                            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3) <=
        lVar3) {
      return -1;
    }
    _Var2 = std::operator==(&ppCVar1[lVar3]->m_name,name);
    if (_Var2) break;
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3;
}

Assistant:

int CaseTreeNode::findChildNdx (const std::string& name) const
{
	for (int ndx = 0; ndx < (int)m_children.size(); ++ndx)
	{
		if (m_children[ndx]->getName() == name)
			return ndx;
	}
	return NOT_FOUND;
}